

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void soul::SanityCheckPass::checkArraySubscript(ArrayElementRef *s)

{
  Expression *pEVar1;
  int iVar2;
  
  pEVar1 = (s->object).object;
  if ((pEVar1 != (Expression *)0x0) && (pEVar1->kind == endpoint)) {
    iVar2 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    if ((char)iVar2 != '\0') {
      return;
    }
  }
  pEVar1 = (s->object).object;
  if (pEVar1 != (Expression *)0x0) {
    throwErrorIfNotArrayOrVector(pEVar1);
    return;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

static void checkArraySubscript (AST::ArrayElementRef& s)
    {
        if (! AST::isResolvedAsEndpoint (s.object))
            throwErrorIfNotArrayOrVector (*s.object);
    }